

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O1

ktx_error_code_e
ktxTexture_VkUploadEx_WithSuballocator
          (ktxTexture *This,ktxVulkanDeviceInfo *vdi,ktxVulkanTexture *vkTexture,
          VkImageTiling tiling,VkImageUsageFlags usageFlags,VkImageLayout finalLayout,
          ktxVulkanTexture_subAllocatorCallbacks *subAllocatorCallbacks)

{
  VkCommandBuffer *ppVVar1;
  VkImage *ppVVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ktx_bool_t kVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  VkCommandBuffer pVVar8;
  ktx_uint8_t *__src;
  undefined4 uVar10;
  VkImage image;
  uint uVar11;
  uint uVar12;
  ktxVulkanFunctions vkFuncs;
  ktxVulkanFunctions vkFuncs_00;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  undefined1 auVar16 [16];
  ktx_bool_t kVar17;
  uint32_t i_1;
  ktx_uint32_t kVar18;
  class_id cVar19;
  VkResult VVar20;
  ktx_error_code_e kVar21;
  uint64_t uVar22;
  VkBufferImageCopy *__ptr;
  VkImageViewType VVar23;
  ulong uVar24;
  VkImageType VVar25;
  uint uVar26;
  VkFormatProperties *pVVar27;
  code *iterCb;
  ktxVulkanFunctions *pkVar28;
  undefined8 *puVar29;
  uint32_t i;
  long lVar30;
  ktx_error_code_e kVar31;
  uint32_t i_2;
  VkFilter blitFilter;
  ktx_uint32_t kVar32;
  bool bVar33;
  byte bVar34;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar35 [16];
  VkDeviceMemory stagingMemory;
  VkBuffer stagingBuffer;
  VkMemoryAllocateInfo memAllocInfo;
  VkImageSubresourceRange subresourceRange_1;
  VkMemoryRequirements memReqs;
  VkDeviceMemory mappableMemory;
  ktx_uint8_t *pMappedStagingBuffer;
  VkImage mappableImage;
  VkImageSubresourceRange subresourceRange;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  VkImageFormatProperties imageFormatProperties;
  VkFormatProperties formatProperties;
  undefined4 uVar36;
  VkImageFormatProperties *pVVar37;
  undefined4 uVar38;
  undefined8 in_stack_fffffffffffffb70;
  undefined8 uVar39;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 uVar40;
  undefined4 in_stack_fffffffffffffb7c;
  undefined8 in_stack_fffffffffffffb80;
  VkImageMemoryBarrier *pVVar41;
  undefined1 in_stack_fffffffffffffb88 [208];
  VkDeviceMemory local_350;
  VkImageUsageFlags local_344;
  VkImageType local_340;
  VkImageCreateFlags local_33c;
  uint64_t local_338;
  VkBuffer local_330;
  VkMemoryAllocateInfo local_328;
  ktxVulkanFunctions *local_308;
  uint local_2fc;
  undefined8 local_2f8;
  ktx_uint32_t kStack_2f0;
  undefined4 uStack_2ec;
  uint local_2e8;
  VkMemoryRequirements local_2e0;
  VkFenceCreateInfo local_2c8;
  ulong local_2b0;
  ktx_uint8_t *local_2a8;
  VkBufferImageCopy *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  ktx_uint8_t *local_288;
  ktx_uint32_t local_280;
  ktx_uint32_t local_27c;
  VkBufferCreateInfo local_278;
  VkSubmitInfo local_238;
  VkImageCreateInfo local_1e8;
  VkCommandBufferBeginInfo local_188;
  VkImageFormatProperties local_168;
  undefined1 local_148 [4];
  undefined1 auStack_144 [12];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  VkImage pVStack_120;
  undefined1 local_118 [192];
  VkBufferImageCopy *local_58;
  VkDevice local_50;
  void *local_48;
  ktxTexture *local_40;
  
  bVar34 = 0;
  local_188.flags = 0;
  local_188._20_4_ = 0;
  local_188.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  local_188.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  local_188._4_4_ = 0;
  local_188.pNext = (void *)0x0;
  local_1e8.pNext = (void *)0x0;
  local_1e8.queueFamilyIndexCount = 0;
  local_1e8._68_4_ = 0;
  local_1e8.pQueueFamilyIndices = (uint32_t *)0x0;
  local_1e8.samples = 0;
  local_1e8.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_1e8.usage = 0;
  local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_1e8.extent.height = 0;
  local_1e8.extent.depth = 0;
  local_1e8.mipLevels = 0;
  local_1e8.arrayLayers = 0;
  local_1e8.flags = 0;
  local_1e8.imageType = VK_IMAGE_TYPE_1D;
  local_1e8.format = VK_FORMAT_UNDEFINED;
  local_1e8.extent.width = 0;
  local_1e8._80_8_ = 0;
  local_1e8.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_1e8._4_4_ = 0;
  local_328.allocationSize = 0;
  local_328.memoryTypeIndex = 0;
  local_328._28_4_ = 0;
  local_328.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_328._4_4_ = 0;
  local_328.pNext = (void *)0x0;
  kVar18 = ktxTexture_GetElementSize(This);
  if (subAllocatorCallbacks != (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    if (subAllocatorCallbacks->allocMemFuncPtr == (ktxVulkanTexture_subAllocatorAllocMemFuncPtr)0x0)
    {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->bindBufferFuncPtr ==
        (ktxVulkanTexture_subAllocatorBindBufferFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->bindImageFuncPtr ==
        (ktxVulkanTexture_subAllocatorBindImageFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->memoryMapFuncPtr ==
        (ktxVulkanTexture_subAllocatorMemoryMapFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->memoryUnmapFuncPtr ==
        (ktxVulkanTexture_subAllocatorMemoryUnmapFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->freeMemFuncPtr == (ktxVulkanTexture_subAllocatorFreeMemFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
  }
  if (vkTexture == (ktxVulkanTexture *)0x0 ||
      (This == (ktxTexture *)0x0 || vdi == (ktxVulkanDeviceInfo *)0x0)) {
    return KTX_INVALID_VALUE;
  }
  if ((This->pData == (ktx_uint8_t *)0x0) && (kVar17 = ktxTexture_isActiveStream(This), !kVar17)) {
    return KTX_INVALID_OPERATION;
  }
  if ((This->numFaces == 6) && (This->numDimensions != 2)) {
    __assert_fail("This->numFaces == 6 ? This->numDimensions == 2 : VK_TRUE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                  ,0x366,
                  "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                 );
  }
  kVar32 = This->numDimensions;
  kVar17 = This->isCubemap;
  uVar11 = This->numLayers * 6;
  if (kVar17 == false) {
    uVar11 = This->numLayers;
  }
  if (2 < kVar32 - 1) {
    __assert_fail("This->numDimensions >= 1 && This->numDimensions <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                  ,0x36e,
                  "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                 );
  }
  kVar5 = This->isArray;
  if (kVar32 == 3) {
    VVar23 = VK_IMAGE_VIEW_TYPE_3D;
    VVar25 = VK_IMAGE_TYPE_3D;
    if (kVar5 != false) {
      __assert_fail("!This->isArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,900,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
  }
  else if (kVar32 == 1) {
    VVar23 = (uint)kVar5 << 2;
    VVar25 = VK_IMAGE_TYPE_1D;
  }
  else {
    if (kVar17 == false) {
      VVar23 = (uint)kVar5 * 4 + VK_IMAGE_VIEW_TYPE_2D;
    }
    else {
      VVar23 = (uint)kVar5 + (uint)kVar5 * 2 + VK_IMAGE_VIEW_TYPE_CUBE;
    }
    VVar25 = VK_IMAGE_TYPE_2D;
  }
  if (This->classId == ktxTexture2_c) {
    cVar19 = This[1].classId;
  }
  else {
    cVar19 = ktxTexture1_GetVkFormat((ktxTexture1 *)This);
  }
  if (cVar19 == 0) {
    return KTX_INVALID_OPERATION;
  }
  local_33c = (uint)kVar17 << 4;
  uVar26 = usageFlags | 2;
  if (tiling != VK_IMAGE_TILING_OPTIMAL) {
    uVar26 = usageFlags;
  }
  local_344 = uVar26 | 3;
  if (This->generateMipmaps == false) {
    local_344 = uVar26;
  }
  pVVar37 = &local_168;
  local_340 = VVar25;
  VVar20 = (*(vdi->vkFuncs).vkGetPhysicalDeviceImageFormatProperties)
                     (vdi->physicalDevice,cVar19,VVar25,tiling,local_344,local_33c,pVVar37);
  if (VVar20 == VK_ERROR_FORMAT_NOT_SUPPORTED) {
    return KTX_INVALID_OPERATION;
  }
  if (local_168.maxArrayLayers < This->numLayers) {
    return KTX_INVALID_OPERATION;
  }
  if (This->generateMipmaps == true) {
    uVar24 = (ulong)cVar19;
    (*(vdi->vkFuncs).vkGetPhysicalDeviceFormatProperties)
              (vdi->physicalDevice,cVar19,(VkFormatProperties *)local_148);
    if (VVar20 != VK_SUCCESS) {
      __assert_fail("vResult == VK_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x3ae,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
    pVVar27 = (VkFormatProperties *)local_148;
    if (tiling == VK_IMAGE_TILING_OPTIMAL) {
      pVVar27 = (VkFormatProperties *)(local_148 + 4);
    }
    uVar26 = pVVar27->linearTilingFeatures & 0xc00;
    if (uVar26 == 0xc00) {
      blitFilter = pVVar27->linearTilingFeatures >> 0xc & VK_FILTER_LINEAR;
      uVar12 = This->baseHeight;
      if (This->baseHeight < This->baseWidth) {
        uVar12 = This->baseWidth;
      }
      if (uVar12 <= This->baseDepth) {
        uVar12 = This->baseDepth;
      }
      auVar35._0_8_ = log2((double)uVar12);
      auVar35._8_8_ = extraout_XMM0_Qb;
      auVar35 = roundsd(auVar35,auVar35,9);
      uVar24 = (ulong)((int)(long)auVar35._0_8_ + 1);
    }
    else {
      blitFilter = VK_FILTER_LINEAR;
    }
    if (uVar26 != 0xc00) {
      return KTX_INVALID_OPERATION;
    }
  }
  else {
    uVar24 = (ulong)This->numLevels;
    blitFilter = VK_FILTER_LINEAR;
  }
  uVar26 = (uint)uVar24;
  if (local_168.maxMipLevels < uVar26) {
    return KTX_INVALID_OPERATION;
  }
  bVar33 = true;
  if ((This->classId != ktxTexture2_c) &&
     (kVar32 = ktxTexture_GetRowPitch(This,0), (kVar18 & 3) != 0)) {
    bVar33 = kVar32 == This->baseWidth * kVar18 && This->numLevels == 1;
  }
  local_308 = &vdi->vkFuncs;
  kVar32 = This->baseHeight;
  vkTexture->width = This->baseWidth;
  vkTexture->height = kVar32;
  vkTexture->depth = This->baseDepth;
  vkTexture->imageLayout = finalLayout;
  vkTexture->imageFormat = cVar19;
  vkTexture->levelCount = uVar26;
  vkTexture->layerCount = uVar11;
  vkTexture->viewType = VVar23;
  vkTexture->vkDestroyImage = (vdi->vkFuncs).vkDestroyImage;
  vkTexture->vkFreeMemory = (vdi->vkFuncs).vkFreeMemory;
  ppVVar1 = &vdi->cmdBuffer;
  (*(vdi->vkFuncs).vkBeginCommandBuffer)(vdi->cmdBuffer,&local_188);
  local_2b0 = uVar24;
  if (tiling == VK_IMAGE_TILING_OPTIMAL) {
    local_350 = (VkDeviceMemory)0x0;
    local_278.pNext = (void *)0x0;
    local_278.pQueueFamilyIndices = (uint32_t *)0x0;
    local_278.usage = 0;
    local_278.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    local_278.queueFamilyIndexCount = 0;
    local_278._44_4_ = 0;
    local_278.flags = 0;
    local_278._20_4_ = 0;
    local_278.size = 0;
    local_278.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    local_278._4_4_ = 0;
    local_2c8.flags = 0;
    local_2c8._20_4_ = 0;
    local_2c8._0_8_ = (VkDeviceMemory)0x8;
    local_2c8.pNext = (void *)0x0;
    local_238.pNext = (void *)0x0;
    local_238.pSignalSemaphores = (VkSemaphore *)0x0;
    local_238.pCommandBuffers = (VkCommandBuffer *)0x0;
    local_238.signalSemaphoreCount = 0;
    local_238._60_4_ = 0;
    local_238.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    local_238.commandBufferCount = 0;
    local_238._44_4_ = 0;
    local_238.waitSemaphoreCount = 0;
    local_238._20_4_ = 0;
    local_238.pWaitSemaphores = (VkSemaphore *)0x0;
    local_238.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    local_238._4_4_ = 0;
    local_278.size = (*This->vtbl->GetDataSizeUncompressed)(This);
    if (bVar33) {
      kVar32 = This->numLevels;
    }
    else {
      kVar32 = This->numLevels;
      if (This->isArray == false) {
        kVar32 = kVar32 * This->numFaces;
      }
      local_278.size = local_278.size + kVar18 * kVar32 * 4;
    }
    __ptr = (VkBufferImageCopy *)malloc((ulong)kVar32 * 0x38);
    kVar31 = KTX_OUT_OF_MEMORY;
    if (__ptr == (VkBufferImageCopy *)0x0) {
LAB_001fd585:
      bVar33 = false;
      kVar21 = kVar31;
    }
    else {
      local_278.usage = 1;
      local_278.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      local_2fc = kVar32;
      (*(vdi->vkFuncs).vkCreateBuffer)(vdi->device,&local_278,vdi->pAllocator,&local_330);
      (*(vdi->vkFuncs).vkGetBufferMemoryRequirements)(vdi->device,local_330,&local_2e0);
      local_328.allocationSize = local_2e0.size;
      lVar30 = 0;
      uVar24 = (ulong)local_2e0.memoryTypeBits;
      do {
        if (((uVar24 & 1) != 0) &&
           ((~(vdi->deviceMemoryProperties).memoryTypes[lVar30].propertyFlags & 6) == 0))
        goto LAB_001fcd93;
        uVar24 = uVar24 >> 1;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 0x20);
      lVar30 = 0;
LAB_001fcd93:
      local_328.memoryTypeIndex = (uint32_t)lVar30;
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        VVar20 = (*(vdi->vkFuncs).vkAllocateMemory)
                           (vdi->device,&local_328,vdi->pAllocator,&local_350);
        if (VVar20 != VK_SUCCESS) {
          free(__ptr);
          goto LAB_001fd585;
        }
        local_338 = 0;
        (*(vdi->vkFuncs).vkBindBufferMemory)(vdi->device,local_330,local_350,0);
        (*(vdi->vkFuncs).vkMapMemory)(vdi->device,local_350,0,local_2e0.size,0,&local_2a8);
        kVar31 = KTX_INVALID_OPERATION;
      }
      else {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = auStack_144._4_8_;
        _local_148 = auVar14 << 0x40;
        uVar22 = (*subAllocatorCallbacks->allocMemFuncPtr)
                           (&local_328,&local_2e0,(uint64_t *)local_148);
        local_338 = uVar22;
        if (uVar22 == 0) {
          free(__ptr);
          kVar31 = KTX_OUT_OF_MEMORY;
LAB_001fd0ef:
          bVar15 = false;
        }
        else {
          if ((VkFence)0x1 < _local_148) {
            free(__ptr);
            kVar31 = KTX_UNSUPPORTED_FEATURE;
            goto LAB_001fd0ef;
          }
          (*subAllocatorCallbacks->bindBufferFuncPtr)(local_330,uVar22);
          (*subAllocatorCallbacks->memoryMapFuncPtr)(uVar22,0,&local_2e0.size,&local_2a8);
          kVar31 = KTX_INVALID_OPERATION;
          bVar15 = true;
        }
        if (!bVar15) goto LAB_001fd585;
      }
      local_298 = 0;
      uVar3 = This->numLayers;
      uVar4 = This->numFaces;
      local_290 = CONCAT44(uVar3,uVar4);
      local_288 = local_2a8;
      local_27c = This->numDimensions;
      __src = This->pData;
      local_2a0 = __ptr;
      local_280 = kVar18;
      if (bVar33) {
        if (__src == (ktx_uint8_t *)0x0) {
          kVar21 = (*This->vtbl->LoadImageData)(This,local_2a8,local_328.allocationSize);
          if (kVar21 != KTX_SUCCESS) {
            bVar33 = false;
            goto joined_r0x001fd589;
          }
        }
        else {
          if (local_328.allocationSize < This->dataSize) {
            __assert_fail("This->dataSize <= memAllocInfo.allocationSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                          ,0x474,
                          "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                         );
          }
          memcpy(local_2a8,__src,This->dataSize);
        }
        (*This->vtbl->IterateLevels)(This,optimalTilingCallback,&local_2a0);
      }
      else if (__src == (ktx_uint8_t *)0x0) {
        (*This->vtbl->IterateLoadLevelFaces)(This,optimalTilingPadCallback,&local_2a0);
      }
      else {
        ktxTexture_IterateLevelFaces(This,optimalTilingPadCallback,&local_2a0);
      }
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        (*(vdi->vkFuncs).vkUnmapMemory)(vdi->device,local_350);
      }
      else {
        (*subAllocatorCallbacks->memoryUnmapFuncPtr)(local_338,0);
      }
      local_1e8.imageType = local_340;
      local_1e8.flags = local_33c;
      local_1e8.arrayLayers = uVar11;
      local_1e8.mipLevels = (uint32_t)local_2b0;
      local_1e8.samples = VK_SAMPLE_COUNT_1_BIT;
      local_1e8.tiling = VK_IMAGE_TILING_OPTIMAL;
      lVar30 = 0;
      local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      local_1e8.usage = local_344;
      local_1e8._80_8_ = local_1e8._80_8_ & 0xffffffff00000000;
      uVar7 = vkTexture->width;
      uVar10 = vkTexture->height;
      local_1e8.extent.depth = vkTexture->depth;
      ppVVar2 = &vkTexture->image;
      local_1e8.format = cVar19;
      local_1e8.extent.width = uVar7;
      local_1e8.extent.height = uVar10;
      (*(vdi->vkFuncs).vkCreateImage)(vdi->device,&local_1e8,vdi->pAllocator,ppVVar2);
      (*(vdi->vkFuncs).vkGetImageMemoryRequirements)(vdi->device,vkTexture->image,&local_2e0);
      uVar38 = (undefined4)((ulong)pVVar37 >> 0x20);
      local_328.allocationSize = local_2e0.size;
      do {
        if (((local_2e0.memoryTypeBits & 1) != 0) &&
           (((vdi->deviceMemoryProperties).memoryTypes[lVar30].propertyFlags & 1) != 0))
        goto LAB_001fd38f;
        local_2e0.memoryTypeBits = local_2e0.memoryTypeBits >> 1;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 0x20);
      lVar30 = 0;
LAB_001fd38f:
      local_328.memoryTypeIndex = (uint32_t)lVar30;
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        (*(vdi->vkFuncs).vkAllocateMemory)
                  (vdi->device,&local_328,vdi->pAllocator,&vkTexture->deviceMemory);
        uVar38 = (undefined4)((ulong)pVVar37 >> 0x20);
        (*(vdi->vkFuncs).vkBindImageMemory)(vdi->device,vkTexture->image,vkTexture->deviceMemory,0);
      }
      else {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = auStack_144._4_8_;
        _local_148 = auVar16 << 0x40;
        uVar22 = (*subAllocatorCallbacks->allocMemFuncPtr)
                           (&local_328,&local_2e0,(uint64_t *)local_148);
        vkTexture->allocationId = uVar22;
        if (uVar22 == 0) {
          kVar31 = KTX_OUT_OF_MEMORY;
          bVar33 = false;
        }
        else if (_local_148 < (VkFence)0x2) {
          (*subAllocatorCallbacks->bindImageFuncPtr)(*ppVVar2,uVar22);
          bVar33 = true;
        }
        else {
          kVar31 = KTX_UNSUPPORTED_FEATURE;
          bVar33 = false;
        }
        if (!bVar33) goto LAB_001fd585;
      }
      local_2f8 = 1;
      kStack_2f0 = This->numLevels;
      uStack_2ec = 0;
      pVVar41 = (VkImageMemoryBarrier *)local_148;
      auStack_144 = SUB1612((undefined1  [16])0x0,4);
      local_148 = (undefined1  [4])0x2d;
      pVStack_120 = *ppVVar2;
      local_128 = 0xffffffffffffffff;
      local_118._0_4_ = 1;
      local_118._4_4_ = 0;
      local_118._12_4_ = 0;
      local_118._20_4_ = 0;
      local_118._16_4_ = uVar11;
      local_138._0_4_ = 0;
      local_138._4_4_ = 0x1000;
      uStack_130._0_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
      uStack_130._4_4_ = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
      uVar39 = 0;
      uVar36 = 0;
      uVar40 = 1;
      local_2e8 = uVar11;
      local_118._8_4_ = kStack_2f0;
      (*(vdi->vkFuncs).vkCmdPipelineBarrier)
                (vdi->cmdBuffer,0x10000,0x10000,0,0,(VkMemoryBarrier *)0x0,0,
                 (VkBufferMemoryBarrier *)0x0,1,pVVar41);
      (*(vdi->vkFuncs).vkCmdCopyBufferToImage)
                (vdi->cmdBuffer,local_330,*ppVVar2,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,local_2fc,
                 __ptr);
      free(__ptr);
      if (This->generateMipmaps == true) {
        generateMipmaps(vkTexture,vdi,blitFilter,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
      }
      else {
        pVVar8 = *ppVVar1;
        image = *ppVVar2;
        pkVar28 = local_308;
        puVar29 = (undefined8 *)&stack0xfffffffffffffb68;
        for (lVar30 = 0x1e; lVar30 != 0; lVar30 = lVar30 + -1) {
          *puVar29 = pkVar28->vkGetInstanceProcAddr;
          pkVar28 = (ktxVulkanFunctions *)((long)pkVar28 + (ulong)bVar34 * -0x10 + 8);
          puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
        }
        subresourceRange_01.baseArrayLayer = uStack_2ec;
        subresourceRange_01.levelCount = kStack_2f0;
        vkFuncs_00.vkGetInstanceProcAddr._4_4_ = uVar38;
        vkFuncs_00.vkGetInstanceProcAddr._0_4_ = uVar36;
        vkFuncs_00.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)uVar39;
        vkFuncs_00.vkAllocateCommandBuffers._0_4_ = uVar40;
        vkFuncs_00.vkAllocateCommandBuffers._4_4_ = in_stack_fffffffffffffb7c;
        vkFuncs_00.vkAllocateMemory = (PFN_vkAllocateMemory)pVVar41;
        vkFuncs_00.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffb88._0_8_;
        vkFuncs_00.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffb88._8_8_;
        vkFuncs_00.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffb88._16_8_;
        vkFuncs_00.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffb88._24_8_;
        vkFuncs_00.vkCmdCopyBufferToImage =
             (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffb88._32_8_;
        vkFuncs_00.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)in_stack_fffffffffffffb88._40_8_
        ;
        vkFuncs_00.vkCreateImage = (PFN_vkCreateImage)in_stack_fffffffffffffb88._48_8_;
        vkFuncs_00.vkDestroyImage = (PFN_vkDestroyImage)in_stack_fffffffffffffb88._56_8_;
        vkFuncs_00.vkCreateBuffer = (PFN_vkCreateBuffer)in_stack_fffffffffffffb88._64_8_;
        vkFuncs_00.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffb88._72_8_;
        vkFuncs_00.vkCreateFence = (PFN_vkCreateFence)in_stack_fffffffffffffb88._80_8_;
        vkFuncs_00.vkDestroyFence = (PFN_vkDestroyFence)in_stack_fffffffffffffb88._88_8_;
        vkFuncs_00.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffb88._96_8_;
        vkFuncs_00.vkFreeCommandBuffers =
             (PFN_vkFreeCommandBuffers)in_stack_fffffffffffffb88._104_8_;
        vkFuncs_00.vkFreeMemory = (PFN_vkFreeMemory)in_stack_fffffffffffffb88._112_8_;
        vkFuncs_00.vkGetBufferMemoryRequirements =
             (PFN_vkGetBufferMemoryRequirements)in_stack_fffffffffffffb88._120_8_;
        vkFuncs_00.vkGetImageMemoryRequirements =
             (PFN_vkGetImageMemoryRequirements)in_stack_fffffffffffffb88._128_8_;
        vkFuncs_00.vkGetImageSubresourceLayout =
             (PFN_vkGetImageSubresourceLayout)in_stack_fffffffffffffb88._136_8_;
        vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties =
             (PFN_vkGetPhysicalDeviceImageFormatProperties)in_stack_fffffffffffffb88._144_8_;
        vkFuncs_00.vkGetPhysicalDeviceFormatProperties =
             (PFN_vkGetPhysicalDeviceFormatProperties)in_stack_fffffffffffffb88._152_8_;
        vkFuncs_00.vkGetPhysicalDeviceMemoryProperties =
             (PFN_vkGetPhysicalDeviceMemoryProperties)in_stack_fffffffffffffb88._160_8_;
        vkFuncs_00.vkMapMemory = (PFN_vkMapMemory)in_stack_fffffffffffffb88._168_8_;
        vkFuncs_00.vkQueueSubmit = (PFN_vkQueueSubmit)in_stack_fffffffffffffb88._176_8_;
        vkFuncs_00.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffb88._184_8_;
        vkFuncs_00.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffb88._192_8_;
        vkFuncs_00.vkWaitForFences = (PFN_vkWaitForFences)in_stack_fffffffffffffb88._200_8_;
        subresourceRange_01.aspectMask = (undefined4)local_2f8;
        subresourceRange_01.baseMipLevel = local_2f8._4_4_;
        subresourceRange_01.layerCount = local_2e8;
        setImageLayout(vkFuncs_00,pVVar8,image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,finalLayout,
                       subresourceRange_01);
      }
      (*(vdi->vkFuncs).vkEndCommandBuffer)(vdi->cmdBuffer);
      (*(vdi->vkFuncs).vkCreateFence)(vdi->device,&local_2c8,vdi->pAllocator,(VkFence *)local_148);
      local_238.commandBufferCount = 1;
      local_238.pCommandBuffers = ppVVar1;
      (*(vdi->vkFuncs).vkQueueSubmit)(vdi->queue,1,&local_238,_local_148);
      (*(vdi->vkFuncs).vkWaitForFences)(vdi->device,1,(VkFence *)local_148,1,100000000000);
      (*(vdi->vkFuncs).vkDestroyFence)(vdi->device,_local_148,vdi->pAllocator);
      if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
        (*(vdi->vkFuncs).vkFreeMemory)(vdi->device,local_350,vdi->pAllocator);
      }
      else {
        (*subAllocatorCallbacks->freeMemFuncPtr)(local_338);
      }
      (*(vdi->vkFuncs).vkDestroyBuffer)(vdi->device,local_330,vdi->pAllocator);
      bVar33 = true;
      kVar21 = kVar31;
    }
    goto joined_r0x001fd589;
  }
  lVar30 = 0;
  local_2c8._0_8_ = (VkDeviceMemory)0x0;
  local_238.pNext = (void *)0x0;
  local_238.pSignalSemaphores = (VkSemaphore *)0x0;
  local_238.pCommandBuffers = (VkCommandBuffer *)0x0;
  local_238.signalSemaphoreCount = 0;
  local_238._60_4_ = 0;
  local_238.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  local_238.commandBufferCount = 0;
  local_238._44_4_ = 0;
  local_238._16_8_ = 0;
  local_238.pWaitSemaphores = (VkSemaphore *)0x0;
  local_238.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  local_238._4_4_ = 0;
  local_1e8.imageType = local_340;
  local_1e8.flags = local_33c;
  uVar6 = vkTexture->width;
  uVar9 = vkTexture->height;
  local_1e8.extent.depth = vkTexture->depth;
  local_1e8.arrayLayers = uVar11;
  local_1e8.mipLevels = uVar26;
  local_1e8.samples = VK_SAMPLE_COUNT_1_BIT;
  local_1e8.tiling = VK_IMAGE_TILING_LINEAR;
  local_1e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_1e8.usage = local_344;
  local_1e8.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;
  local_1e8.format = cVar19;
  local_1e8.extent.width = uVar6;
  local_1e8.extent.height = uVar9;
  (*(vdi->vkFuncs).vkCreateImage)(vdi->device,&local_1e8,vdi->pAllocator,(VkImage *)&local_2a0);
  (*(vdi->vkFuncs).vkGetImageMemoryRequirements)(vdi->device,(VkImage)local_2a0,&local_2e0);
  local_328.allocationSize = local_2e0.size;
  do {
    if (((local_2e0.memoryTypeBits & 1) != 0) &&
       ((~(vdi->deviceMemoryProperties).memoryTypes[lVar30].propertyFlags & 6) == 0))
    goto LAB_001fcb6d;
    local_2e0.memoryTypeBits = local_2e0.memoryTypeBits >> 1;
    lVar30 = lVar30 + 1;
  } while (lVar30 != 0x20);
  lVar30 = 0;
LAB_001fcb6d:
  local_328.memoryTypeIndex = (uint32_t)lVar30;
  if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    VVar20 = (*(vdi->vkFuncs).vkAllocateMemory)
                       (vdi->device,&local_328,vdi->pAllocator,(VkDeviceMemory *)&local_2c8);
    if (VVar20 != VK_SUCCESS) {
      kVar21 = KTX_OUT_OF_MEMORY;
      goto LAB_001fce34;
    }
    (*(vdi->vkFuncs).vkBindImageMemory)
              (vdi->device,(VkImage)local_2a0,(VkDeviceMemory)local_2c8._0_8_,0);
    kVar21 = KTX_INVALID_OPERATION;
  }
  else {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auStack_144._4_8_;
    _local_148 = auVar13 << 0x40;
    uVar22 = (*subAllocatorCallbacks->allocMemFuncPtr)(&local_328,&local_2e0,(uint64_t *)local_148);
    vkTexture->allocationId = uVar22;
    if (uVar22 == 0) {
      kVar21 = KTX_OUT_OF_MEMORY;
LAB_001fce0e:
      bVar15 = false;
    }
    else {
      if ((VkFence)0x1 < _local_148) {
        kVar21 = KTX_UNSUPPORTED_FEATURE;
        goto LAB_001fce0e;
      }
      (*subAllocatorCallbacks->bindImageFuncPtr)((VkImage)local_2a0,uVar22);
      kVar21 = KTX_INVALID_OPERATION;
      bVar15 = true;
    }
    if (!bVar15) {
LAB_001fce34:
      bVar33 = false;
      goto joined_r0x001fd589;
    }
  }
  memcpy(local_148,local_308,0xf0);
  if (bVar33) {
    iterCb = linearTilingCallback;
  }
  else {
    iterCb = linearTilingPadCallback;
  }
  local_58 = local_2a0;
  local_50 = vdi->device;
  local_40 = This;
  if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    (*(vdi->vkFuncs).vkMapMemory)
              (local_50,(VkDeviceMemory)local_2c8._0_8_,0,local_2e0.size,0,&local_48);
  }
  else {
    (*subAllocatorCallbacks->memoryMapFuncPtr)(vkTexture->allocationId,0,&local_2e0.size,&local_48);
  }
  kVar17 = ktxTexture_isActiveStream(This);
  if (kVar17) {
    (*This->vtbl->IterateLoadLevelFaces)(This,iterCb,local_148);
  }
  else {
    ktxTexture_IterateLevelFaces(This,iterCb,local_148);
  }
  if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    (*(vdi->vkFuncs).vkUnmapMemory)(vdi->device,(VkDeviceMemory)local_2c8._0_8_);
  }
  else {
    (*subAllocatorCallbacks->memoryUnmapFuncPtr)(vkTexture->allocationId,0);
  }
  vkTexture->image = (VkImage)local_2a0;
  if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    vkTexture->deviceMemory = (VkDeviceMemory)local_2c8._0_8_;
  }
  if (This->generateMipmaps == true) {
    generateMipmaps(vkTexture,vdi,blitFilter,VK_IMAGE_LAYOUT_PREINITIALIZED);
  }
  else {
    local_278.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    local_278._4_4_ = 0;
    local_278.pNext = (void *)(local_2b0 & 0xffffffff);
    local_278.flags = uVar11;
    pVVar8 = *ppVVar1;
    pkVar28 = local_308;
    puVar29 = (undefined8 *)&stack0xfffffffffffffb68;
    for (lVar30 = 0x1e; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar29 = pkVar28->vkGetInstanceProcAddr;
      pkVar28 = (ktxVulkanFunctions *)((long)pkVar28 + (ulong)bVar34 * -0x10 + 8);
      puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
    }
    vkFuncs.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffb70;
    vkFuncs.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)pVVar37;
    vkFuncs.vkAllocateCommandBuffers._0_4_ = in_stack_fffffffffffffb78;
    vkFuncs.vkAllocateCommandBuffers._4_4_ = in_stack_fffffffffffffb7c;
    vkFuncs.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffb80;
    vkFuncs.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffb88._0_8_;
    vkFuncs.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffb88._8_8_;
    vkFuncs.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffb88._16_8_;
    vkFuncs.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffb88._24_8_;
    vkFuncs.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffb88._32_8_;
    vkFuncs.vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)in_stack_fffffffffffffb88._40_8_;
    vkFuncs.vkCreateImage = (PFN_vkCreateImage)in_stack_fffffffffffffb88._48_8_;
    vkFuncs.vkDestroyImage = (PFN_vkDestroyImage)in_stack_fffffffffffffb88._56_8_;
    vkFuncs.vkCreateBuffer = (PFN_vkCreateBuffer)in_stack_fffffffffffffb88._64_8_;
    vkFuncs.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffb88._72_8_;
    vkFuncs.vkCreateFence = (PFN_vkCreateFence)in_stack_fffffffffffffb88._80_8_;
    vkFuncs.vkDestroyFence = (PFN_vkDestroyFence)in_stack_fffffffffffffb88._88_8_;
    vkFuncs.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffb88._96_8_;
    vkFuncs.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_fffffffffffffb88._104_8_;
    vkFuncs.vkFreeMemory = (PFN_vkFreeMemory)in_stack_fffffffffffffb88._112_8_;
    vkFuncs.vkGetBufferMemoryRequirements =
         (PFN_vkGetBufferMemoryRequirements)in_stack_fffffffffffffb88._120_8_;
    vkFuncs.vkGetImageMemoryRequirements =
         (PFN_vkGetImageMemoryRequirements)in_stack_fffffffffffffb88._128_8_;
    vkFuncs.vkGetImageSubresourceLayout =
         (PFN_vkGetImageSubresourceLayout)in_stack_fffffffffffffb88._136_8_;
    vkFuncs.vkGetPhysicalDeviceImageFormatProperties =
         (PFN_vkGetPhysicalDeviceImageFormatProperties)in_stack_fffffffffffffb88._144_8_;
    vkFuncs.vkGetPhysicalDeviceFormatProperties =
         (PFN_vkGetPhysicalDeviceFormatProperties)in_stack_fffffffffffffb88._152_8_;
    vkFuncs.vkGetPhysicalDeviceMemoryProperties =
         (PFN_vkGetPhysicalDeviceMemoryProperties)in_stack_fffffffffffffb88._160_8_;
    vkFuncs.vkMapMemory = (PFN_vkMapMemory)in_stack_fffffffffffffb88._168_8_;
    vkFuncs.vkQueueSubmit = (PFN_vkQueueSubmit)in_stack_fffffffffffffb88._176_8_;
    vkFuncs.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffb88._184_8_;
    vkFuncs.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffb88._192_8_;
    vkFuncs.vkWaitForFences = (PFN_vkWaitForFences)in_stack_fffffffffffffb88._200_8_;
    subresourceRange_00._8_8_ = local_278.pNext;
    subresourceRange_00.aspectMask = local_278.sType;
    subresourceRange_00.baseMipLevel = local_278._4_4_;
    subresourceRange_00.layerCount = local_278.flags;
    setImageLayout(vkFuncs,pVVar8,(VkImage)local_2a0,VK_IMAGE_LAYOUT_PREINITIALIZED,finalLayout,
                   subresourceRange_00);
  }
  (*(vdi->vkFuncs).vkEndCommandBuffer)(vdi->cmdBuffer);
  local_238._16_8_ = local_238._16_8_ & 0xffffffff00000000;
  local_238.commandBufferCount = 1;
  local_238.pCommandBuffers = ppVVar1;
  (*(vdi->vkFuncs).vkQueueSubmit)(vdi->queue,1,&local_238,(VkFence)0x0);
  (*(vdi->vkFuncs).vkQueueWaitIdle)(vdi->queue);
  bVar33 = true;
joined_r0x001fd589:
  if (bVar33) {
    kVar21 = KTX_SUCCESS;
  }
  return kVar21;
}

Assistant:

KTX_error_code
ktxTexture_VkUploadEx_WithSuballocator(ktxTexture* This, ktxVulkanDeviceInfo* vdi,
                                       ktxVulkanTexture* vkTexture,
                                       VkImageTiling tiling,
                                       VkImageUsageFlags usageFlags,
                                       VkImageLayout finalLayout,
                                       ktxVulkanTexture_subAllocatorCallbacks* subAllocatorCallbacks)
{
    KTX_error_code           kResult;
    VkFilter                 blitFilter = VK_FILTER_LINEAR;
    VkFormat                 vkFormat;
    VkImageType              imageType;
    VkImageViewType          viewType;
    VkImageCreateFlags       createFlags = 0;
    VkImageFormatProperties  imageFormatProperties;
    VkResult                 vResult;
    VkCommandBufferBeginInfo cmdBufBeginInfo = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
        .pNext = NULL
    };
    VkImageCreateInfo        imageCreateInfo = {
         .sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
         .pNext = NULL
    };
    VkMemoryAllocateInfo     memAllocInfo = {
        .sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
        .pNext = NULL,
        .allocationSize = 0,
        .memoryTypeIndex = 0
    };
    VkMemoryRequirements     memReqs;
    ktx_uint32_t             numImageLayers, numImageLevels;
    ktx_uint32_t elementSize = ktxTexture_GetElementSize(This);
    ktx_bool_t               canUseFasterPath;
    ktx_bool_t               useSuballocator = false;
    if (subAllocatorCallbacks) {
        if (subAllocatorCallbacks->allocMemFuncPtr &&
            subAllocatorCallbacks->bindBufferFuncPtr &&
            subAllocatorCallbacks->bindImageFuncPtr &&
            subAllocatorCallbacks->memoryMapFuncPtr &&
            subAllocatorCallbacks->memoryUnmapFuncPtr &&
            subAllocatorCallbacks->freeMemFuncPtr)
            useSuballocator = true;
        else
            return KTX_INVALID_VALUE;
    }

    if (!vdi || !This || !vkTexture) {
        return KTX_INVALID_VALUE;
    }

    if (!This->pData && !ktxTexture_isActiveStream(This)) {
        /* Nothing to upload. */
        return KTX_INVALID_OPERATION;
    }

    /* _ktxCheckHeader should have caught this. */
    assert(This->numFaces == 6 ? This->numDimensions == 2 : VK_TRUE);

    numImageLayers = This->numLayers;
    if (This->isCubemap) {
        numImageLayers *= 6;
        createFlags = VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
    }

    assert(This->numDimensions >= 1 && This->numDimensions <= 3);
    switch (This->numDimensions) {
      case 1:
        imageType = VK_IMAGE_TYPE_1D;
        viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_1D_ARRAY : VK_IMAGE_VIEW_TYPE_1D;
        break;
      case 2:
      default: // To keep compilers happy.
        imageType = VK_IMAGE_TYPE_2D;
        if (This->isCubemap)
            viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_CUBE_ARRAY : VK_IMAGE_VIEW_TYPE_CUBE;
        else
            viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_2D_ARRAY : VK_IMAGE_VIEW_TYPE_2D;
        break;
      case 3:
        imageType = VK_IMAGE_TYPE_3D;
        /* 3D array textures not supported in Vulkan. Attempts to create or
         * load them should have been trapped long before this.
         */
        assert(!This->isArray);
        viewType = VK_IMAGE_VIEW_TYPE_3D;
        break;
    }

    vkFormat = ktxTexture_GetVkFormat(This);
    if (vkFormat == VK_FORMAT_UNDEFINED) {
        return KTX_INVALID_OPERATION;
    }

    /* Get device properties for the requested image format */
    if (tiling == VK_IMAGE_TILING_OPTIMAL) {
        // Ensure we can copy from staging buffer to image.
        usageFlags |= VK_IMAGE_USAGE_TRANSFER_DST_BIT;
    }
    if (This->generateMipmaps) {
        // Ensure we can blit between levels.
        usageFlags |= (VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT);
    }
    vResult = vdi->vkFuncs.vkGetPhysicalDeviceImageFormatProperties(vdi->physicalDevice,
                                                      vkFormat,
                                                      imageType,
                                                      tiling,
                                                      usageFlags,
                                                      createFlags,
                                                      &imageFormatProperties);
    if (vResult == VK_ERROR_FORMAT_NOT_SUPPORTED) {
        return KTX_INVALID_OPERATION;
    }
    if (This->numLayers > imageFormatProperties.maxArrayLayers) {
        return KTX_INVALID_OPERATION;
    }

    if (This->generateMipmaps) {
        uint32_t max_dim;
        VkFormatProperties    formatProperties;
        VkFormatFeatureFlags  formatFeatureFlags;
        VkFormatFeatureFlags  neededFeatures
            = VK_FORMAT_FEATURE_BLIT_DST_BIT | VK_FORMAT_FEATURE_BLIT_SRC_BIT;
        vdi->vkFuncs.vkGetPhysicalDeviceFormatProperties(vdi->physicalDevice,
                                            vkFormat,
                                            &formatProperties);
        assert(vResult == VK_SUCCESS);
        if (tiling == VK_IMAGE_TILING_OPTIMAL)
            formatFeatureFlags = formatProperties.optimalTilingFeatures;
        else
            formatFeatureFlags = formatProperties.linearTilingFeatures;

        if ((formatFeatureFlags & neededFeatures) != neededFeatures)
            return KTX_INVALID_OPERATION;

        if (formatFeatureFlags & VK_FORMAT_FEATURE_SAMPLED_IMAGE_FILTER_LINEAR_BIT)
            blitFilter = VK_FILTER_LINEAR;
        else
            blitFilter = VK_FILTER_NEAREST; // XXX INVALID_OP?

        max_dim = MAX(MAX(This->baseWidth, This->baseHeight), This->baseDepth);
        numImageLevels = (uint32_t)floor(log2(max_dim)) + 1;
    } else {
        numImageLevels = This->numLevels;
    }

    if (numImageLevels > imageFormatProperties.maxMipLevels) {
        return KTX_INVALID_OPERATION;
    }

    if (This->classId == ktxTexture2_c) {
        canUseFasterPath = KTX_TRUE;
    } else {
        ktx_uint32_t actualRowPitch = ktxTexture_GetRowPitch(This, 0);
        ktx_uint32_t tightRowPitch = elementSize * This->baseWidth;
        // If the texture's images do not have any row padding, we can use a
        // faster path. Only uncompressed textures might have padding.
        //
        // The first test in the if will match compressed textures, because
        // they all have a block size that is a multiple of 4, as well as
        // a class of uncompressed textures that will never need padding.
        //
        // The second test matches textures whose level 0 has no padding. Any
        // texture whose block size is not a multiple of 4 will need padding
        // at some miplevel even if level 0 does not. So, if more than 1 level
        // exists, we must use the slower path.
        //
        // Note all elementSizes > 4 Will be a multiple of 4, so only
        // elementSizes of 1, 2 & 3 are a concern here.
        if (elementSize % 4 == 0  /* There'll be no padding at any level. */
               /* There is no padding at level 0 and no other levels. */
            || (This->numLevels == 1 && actualRowPitch == tightRowPitch))
            canUseFasterPath = KTX_TRUE;
        else
            canUseFasterPath = KTX_FALSE;
    }

    vkTexture->width = This->baseWidth;
    vkTexture->height = This->baseHeight;
    vkTexture->depth = This->baseDepth;
    vkTexture->imageLayout = finalLayout;
    vkTexture->imageFormat = vkFormat;
    vkTexture->levelCount = numImageLevels;
    vkTexture->layerCount = numImageLayers;
    vkTexture->viewType = viewType;
    vkTexture->vkDestroyImage = vdi->vkFuncs.vkDestroyImage;
    vkTexture->vkFreeMemory = vdi->vkFuncs.vkFreeMemory;

    VK_CHECK_RESULT(
            vdi->vkFuncs.vkBeginCommandBuffer(vdi->cmdBuffer, &cmdBufBeginInfo)
            );

    if (tiling == VK_IMAGE_TILING_OPTIMAL)
    {
        // Create a host-visible staging buffer that contains the raw image data
        VkBuffer stagingBuffer;
        VkDeviceMemory stagingMemory = VK_NULL_HANDLE;
        VkBufferImageCopy* copyRegions;
        VkDeviceSize textureSize;
        VkBufferCreateInfo bufferCreateInfo = {
          .sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
          .pNext = NULL
        };
        VkImageSubresourceRange subresourceRange;
        VkFence copyFence;
        VkFenceCreateInfo fenceCreateInfo = {
            .sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,
            .pNext = NULL,
            .flags = VK_FLAGS_NONE
        };
        VkSubmitInfo submitInfo = {
            .sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
            .pNext = NULL
        };
        ktx_uint8_t* pMappedStagingBuffer;
        ktx_uint32_t numCopyRegions;
        user_cbdata_optimal cbData;


        textureSize = ktxTexture_GetDataSizeUncompressed(This);
        bufferCreateInfo.size = textureSize;
        if (canUseFasterPath) {
            /*
             * Because all array layers and faces are the same size they can
             * be copied in a single operation so there'll be 1 copy per mip
             * level.
             */
            numCopyRegions = This->numLevels;
        } else {
            /*
             * Have to copy all images individually into the staging
             * buffer so we can place them at correct multiples of
             * elementSize and 4 and also need a copy region per image
             * in case they end up with padding between them.
             */
            numCopyRegions = This->isArray ? This->numLevels
                                  : This->numLevels * This->numFaces;
            /*
             * Add extra space to allow for possible padding described
             * above. A bit ad-hoc but it's only a small amount of
             * memory.
             */
            bufferCreateInfo.size += numCopyRegions * elementSize * 4;
        }
        copyRegions = (VkBufferImageCopy*)malloc(sizeof(VkBufferImageCopy)
                                                   * numCopyRegions);
        if (copyRegions == NULL) {
            return KTX_OUT_OF_MEMORY;
        }

        // This buffer is used as a transfer source for the buffer copy
        bufferCreateInfo.usage = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;
        bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateBuffer(vdi->device, &bufferCreateInfo,
                                       vdi->pAllocator, &stagingBuffer));

        // Get memory requirements for the staging buffer (alignment,
        // memory type bits)
        vdi->vkFuncs.vkGetBufferMemoryRequirements(vdi->device, stagingBuffer, &memReqs);

        memAllocInfo.allocationSize = memReqs.size;
        // Get memory type index for a host visible buffer
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
                vdi,
                memReqs.memoryTypeBits,
                VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT
              | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT
        );

        uint64_t stagingAllocId = 0ull;
        if (!useSuballocator) {
            vResult = vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo,
                vdi->pAllocator, &stagingMemory);
            if (vResult != VK_SUCCESS) {
                free(copyRegions);
                return KTX_OUT_OF_MEMORY;
            }
            VK_CHECK_RESULT(
                    vdi->vkFuncs.vkBindBufferMemory(vdi->device, stagingBuffer,
                        stagingMemory, 0));

            VK_CHECK_RESULT(
                    vdi->vkFuncs.vkMapMemory(vdi->device, stagingMemory, 0,
                        memReqs.size, 0,
                        (void**)&pMappedStagingBuffer));
        }
        else {
            uint64_t numPages = 0ull;
            stagingAllocId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (stagingAllocId == 0ull) {
                free(copyRegions);
                return KTX_OUT_OF_MEMORY;
            }
            if (numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                free(copyRegions);
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindBufferFuncPtr(stagingBuffer, stagingAllocId));
            VK_CHECK_RESULT(
                subAllocatorCallbacks->memoryMapFuncPtr(stagingAllocId, 0ull, 
                &memReqs.size,
                (void**)&pMappedStagingBuffer));
        }

        cbData.offset = 0;
        cbData.region = copyRegions;
        cbData.numFaces = This->numFaces;
        cbData.numLayers = This->numLayers;
        cbData.dest = pMappedStagingBuffer;
        cbData.elementSize = elementSize;
        cbData.numDimensions = This->numDimensions;
#if defined(_DEBUG)
        cbData.regionsArrayEnd = copyRegions + numCopyRegions;
#endif
        if (canUseFasterPath) {
            // Bulk load the data to the staging buffer and iterate
            // over levels.

            if (This->pData) {
                // Image data has already been loaded. Copy to staging
                // buffer.
                assert(This->dataSize <= memAllocInfo.allocationSize);
                memcpy(pMappedStagingBuffer, This->pData, This->dataSize);
            } else {
                /* Load the image data directly into the staging buffer. */
                /* The strange cast quiets an Xcode warning when building
                 * for the Generic iOS Device where size_t is 32-bit even
                 * when building for arm64. */
                kResult = ktxTexture_LoadImageData(This,
                                      pMappedStagingBuffer,
                                      (ktx_size_t)memAllocInfo.allocationSize);
                if (kResult != KTX_SUCCESS)
                    return kResult;
            }

            // Iterate over mip levels to set up the copy regions.
            kResult = ktxTexture_IterateLevels(This,
                                               optimalTilingCallback,
                                               &cbData);
            // XXX Check for possible errors.
        } else {
            // Iterate over face-levels with callback that copies the
            // face-levels to Vulkan-valid offsets in the staging buffer while
            // removing padding. Using face-levels minimizes pre-staging-buffer
            // buffering, in the event the data is not already loaded.
            if (This->pData) {
                kResult = ktxTexture_IterateLevelFaces(
                                            This,
                                            optimalTilingPadCallback,
                                            &cbData);
            } else {
                kResult = ktxTexture_IterateLoadLevelFaces(
                                            This,
                                            optimalTilingPadCallback,
                                            &cbData);
                // XXX Check for possible errors.
            }
        }

        if (!useSuballocator)
            vdi->vkFuncs.vkUnmapMemory(vdi->device, stagingMemory);
        else
            subAllocatorCallbacks->memoryUnmapFuncPtr(stagingAllocId, 0ull);

        // Create optimal tiled target image
        imageCreateInfo.imageType = imageType;
        imageCreateInfo.flags = createFlags;
        imageCreateInfo.format = vkFormat;
        // numImageLevels ensures enough levels for generateMipmaps.
        imageCreateInfo.mipLevels = numImageLevels;
        imageCreateInfo.arrayLayers = numImageLayers;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
        imageCreateInfo.usage = usageFlags;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        imageCreateInfo.extent.width = vkTexture->width;
        imageCreateInfo.extent.height = vkTexture->height;
        imageCreateInfo.extent.depth = vkTexture->depth;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateImage(vdi->device, &imageCreateInfo,
                                      vdi->pAllocator, &vkTexture->image));

        vdi->vkFuncs.vkGetImageMemoryRequirements(vdi->device, vkTexture->image, &memReqs);

        memAllocInfo.allocationSize = memReqs.size;
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
            vdi, memReqs.memoryTypeBits,
            VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

        if (!useSuballocator) {
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo,
                    vdi->pAllocator,
                    &vkTexture->deviceMemory));
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkBindImageMemory(vdi->device, vkTexture->image,
                    vkTexture->deviceMemory, 0));
        }
        else {
            uint64_t numPages = 0ull;
            vkTexture->allocationId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (vkTexture->allocationId == 0ull) {
                return KTX_OUT_OF_MEMORY;
            }
            if(numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindImageFuncPtr(vkTexture->image, vkTexture->allocationId));
        }

        subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.levelCount = This->numLevels;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.layerCount = numImageLayers;

        // Image barrier to transition, possibly only the base level, image
        // layout to TRANSFER_DST_OPTIMAL so it can be used as the copy
        // destination.
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_UNDEFINED,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            subresourceRange);

        // Copy mip levels from staging buffer
        vdi->vkFuncs.vkCmdCopyBufferToImage(
            vdi->cmdBuffer, stagingBuffer,
            vkTexture->image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            numCopyRegions, copyRegions
            );

        free(copyRegions);

        if (This->generateMipmaps) {
            generateMipmaps(vkTexture, vdi,
                            blitFilter, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
        } else {
            // Transition image layout to finalLayout after all mip levels
            // have been copied.
            // In this case numImageLevels == This->numLevels
            //subresourceRange.levelCount = numImageLevels;
            setImageLayout(
                vdi->vkFuncs,
                vdi->cmdBuffer,
                vkTexture->image,
                VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                finalLayout,
                subresourceRange);
        }

        // Submit command buffer containing copy and image layout commands
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkEndCommandBuffer(vdi->cmdBuffer));

        // Create a fence to make sure that the copies have finished before
        // continuing
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateFence(vdi->device, &fenceCreateInfo,
                                      vdi->pAllocator, &copyFence));

        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = &vdi->cmdBuffer;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkQueueSubmit(vdi->queue, 1, &submitInfo, copyFence));

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkWaitForFences(vdi->device, 1, &copyFence,
                                        VK_TRUE, DEFAULT_FENCE_TIMEOUT));

        vdi->vkFuncs.vkDestroyFence(vdi->device, copyFence, vdi->pAllocator);

        // Clean up staging resources
        if (!useSuballocator)
            vdi->vkFuncs.vkFreeMemory(vdi->device, stagingMemory, vdi->pAllocator);
        else
            subAllocatorCallbacks->freeMemFuncPtr(stagingAllocId);
        vdi->vkFuncs.vkDestroyBuffer(vdi->device, stagingBuffer, vdi->pAllocator);
    }
    else
    {
        VkImage mappableImage;
        VkDeviceMemory mappableMemory = VK_NULL_HANDLE;
        VkFence nullFence = { VK_NULL_HANDLE };
        VkSubmitInfo submitInfo = {
            .sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
            .pNext = NULL
        };
        user_cbdata_linear cbData;
        PFNKTXITERCB callback;

        imageCreateInfo.imageType = imageType;
        imageCreateInfo.flags = createFlags;
        imageCreateInfo.format = vkFormat;
        imageCreateInfo.extent.width = vkTexture->width;
        imageCreateInfo.extent.height = vkTexture->height;
        imageCreateInfo.extent.depth = vkTexture->depth;
        // numImageLevels ensures enough levels for generateMipmaps.
        imageCreateInfo.mipLevels = numImageLevels;
        imageCreateInfo.arrayLayers = numImageLayers;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_LINEAR;
        imageCreateInfo.usage = usageFlags;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;

        // Load mip map level 0 to linear tiling image
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateImage(vdi->device, &imageCreateInfo,
                                      vdi->pAllocator, &mappableImage));

        // Get memory requirements for this image
        // like size and alignment
        vdi->vkFuncs.vkGetImageMemoryRequirements(vdi->device, mappableImage, &memReqs);
        // Set memory allocation size to required memory size
        memAllocInfo.allocationSize = memReqs.size;

        // Get memory type that can be mapped to host memory
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
                vdi,
                memReqs.memoryTypeBits,
                VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);

        // Allocate host memory
        if (!useSuballocator) {
            vResult = vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo, vdi->pAllocator,
                &mappableMemory);
            if (vResult != VK_SUCCESS) {
                return KTX_OUT_OF_MEMORY;
            }
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkBindImageMemory(vdi->device, mappableImage,
                    mappableMemory, 0));
        }
        else {
            uint64_t numPages = 0ull;
            vkTexture->allocationId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (vkTexture->allocationId == 0ull) {
                return KTX_OUT_OF_MEMORY;
            }
            if (numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindImageFuncPtr(mappableImage, vkTexture->allocationId));
        }

        cbData.vkFuncs = vdi->vkFuncs;
        cbData.destImage = mappableImage;
        cbData.device = vdi->device;
        cbData.texture = This;
        callback = canUseFasterPath ?
                         linearTilingCallback : linearTilingPadCallback;

        // Map image memory
        if (!useSuballocator) {
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkMapMemory(vdi->device, mappableMemory, 0,
                    memReqs.size, 0, (void**)&cbData.dest));
        }
        else {
            VK_CHECK_RESULT(
                subAllocatorCallbacks->memoryMapFuncPtr(vkTexture->allocationId, 0ull,
                    &memReqs.size, (void**)&cbData.dest));
        }

        // Iterate over images to copy texture data into mapped image memory.
        if (ktxTexture_isActiveStream(This)) {
            kResult = ktxTexture_IterateLoadLevelFaces(This,
                                                       callback,
                                                       &cbData);
        } else {
            kResult = ktxTexture_IterateLevelFaces(This,
                                                   callback,
                                                   &cbData);
        }
        // XXX Check for possible errors
        if (!useSuballocator)
            vdi->vkFuncs.vkUnmapMemory(vdi->device, mappableMemory);
        else
            subAllocatorCallbacks->memoryUnmapFuncPtr(vkTexture->allocationId, 0ull);

        // Linear tiled images can be directly used as textures.
        vkTexture->image = mappableImage;
        if (!useSuballocator) vkTexture->deviceMemory = mappableMemory;

        if (This->generateMipmaps) {
            generateMipmaps(vkTexture, vdi,
                            blitFilter,
                            VK_IMAGE_LAYOUT_PREINITIALIZED);
        } else {
            VkImageSubresourceRange subresourceRange;
            subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
            subresourceRange.baseMipLevel = 0;
            subresourceRange.levelCount = numImageLevels;
            subresourceRange.baseArrayLayer = 0;
            subresourceRange.layerCount = numImageLayers;

           // Transition image layout to finalLayout.
            setImageLayout(
                vdi->vkFuncs,
                vdi->cmdBuffer,
                vkTexture->image,
                VK_IMAGE_LAYOUT_PREINITIALIZED,
                finalLayout,
                subresourceRange);
        }

        // Submit command buffer containing image layout commands
        VK_CHECK_RESULT(vdi->vkFuncs.vkEndCommandBuffer(vdi->cmdBuffer));

        submitInfo.waitSemaphoreCount = 0;
        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = &vdi->cmdBuffer;

        VK_CHECK_RESULT(vdi->vkFuncs.vkQueueSubmit(vdi->queue, 1, &submitInfo, nullFence));
        VK_CHECK_RESULT(vdi->vkFuncs.vkQueueWaitIdle(vdi->queue));
    }
    return KTX_SUCCESS;
}